

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall webpp::Logger::info(Logger *this,string *msg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[INFO]: ");
  poVar1 = std::operator<<(poVar1,(string *)msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void info(const std::string msg) {
    std::cout << "[INFO]: " << msg << std::endl;
  }